

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcolr.c
# Opt level: O1

FT_Bool read_color_line(Colr *colr,FT_Byte *color_line_p,FT_ColorLine *colorline,
                       FT_Bool read_variable)

{
  FT_Byte *p;
  
  if (((colr->paints_start_v1 <= color_line_p) &&
      (color_line_p <= (FT_Byte *)((long)colr->table + (colr->table_size - 3)))) &&
     (*color_line_p < (FT_COLR_PAINT_EXTEND_REFLECT|FT_COLR_PAINT_EXTEND_REPEAT))) {
    colorline->extend = (uint)*color_line_p;
    (colorline->color_stop_iterator).num_color_stops =
         (uint)(ushort)(*(ushort *)(color_line_p + 1) << 8 | *(ushort *)(color_line_p + 1) >> 8);
    (colorline->color_stop_iterator).p = color_line_p + 3;
    (colorline->color_stop_iterator).current_color_stop = 0;
    (colorline->color_stop_iterator).read_variable = read_variable;
    return '\x01';
  }
  return '\0';
}

Assistant:

static FT_Bool
  read_color_line( Colr*          colr,
                   FT_Byte*       color_line_p,
                   FT_ColorLine*  colorline,
                   FT_Bool        read_variable )
  {
    FT_Byte*        p = color_line_p;
    FT_PaintExtend  paint_extend;


    ENSURE_READ_BYTES( 3 );

    paint_extend = (FT_PaintExtend)FT_NEXT_BYTE( p );
    if ( paint_extend > FT_COLR_PAINT_EXTEND_REFLECT )
      return 0;

    colorline->extend = paint_extend;

    colorline->color_stop_iterator.num_color_stops    = FT_NEXT_USHORT( p );
    colorline->color_stop_iterator.p                  = p;
    colorline->color_stop_iterator.current_color_stop = 0;
    colorline->color_stop_iterator.read_variable      = read_variable;

    return 1;
  }